

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O2

Map * add_gh_stairs_room(RandomizerWorld *world,MapPalette *pal,uint16_t map_id)

{
  Map *this;
  Map *map;
  
  this = (Map *)operator_new(0xe0);
  map = World::map(&world->super_World,0xda);
  Map::Map(this,map);
  Map::clear_entities(this);
  this->_id = map_id;
  this->_palette = pal;
  this->_background_music = '\x12';
  World::add_map(&world->super_World,this);
  return this;
}

Assistant:

static Map* add_gh_stairs_room(RandomizerWorld& world, MapPalette* pal, uint16_t map_id)
{
    Map* map = new Map(*world.map(MAP_THIEVES_HIDEOUT_218));
    map->clear_entities();
    map->id(map_id);
    map->palette(pal);
    map->background_music(18);

    world.add_map(map);
    return map;
}